

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float width,float height,float zNear,float zFar,
          bool directX)

{
  float *pfVar1;
  bool directX_local;
  float zFar_local;
  float zNear_local;
  float height_local;
  float width_local;
  Matrix4f *m;
  
  Matrix4f(__return_storage_ptr__,0.0);
  pfVar1 = operator()(__return_storage_ptr__,0,0);
  *pfVar1 = 2.0 / width;
  pfVar1 = operator()(__return_storage_ptr__,1,1);
  *pfVar1 = 2.0 / height;
  pfVar1 = operator()(__return_storage_ptr__,3,3);
  *pfVar1 = 1.0;
  pfVar1 = operator()(__return_storage_ptr__,0,3);
  *pfVar1 = -1.0;
  pfVar1 = operator()(__return_storage_ptr__,1,3);
  *pfVar1 = -1.0;
  if (directX) {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = 1.0 / (zNear - zFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = zNear / (zNear - zFar);
  }
  else {
    pfVar1 = operator()(__return_storage_ptr__,2,2);
    *pfVar1 = 2.0 / (zNear - zFar);
    pfVar1 = operator()(__return_storage_ptr__,2,3);
    *pfVar1 = (zNear + zFar) / (zNear - zFar);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float width, float height, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / width;
	m( 1, 1 ) = 2.0f / height;
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = -1;
	m( 1, 3 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}